

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSetWebServerRootDir(char *rootDir)

{
  int iVar1;
  size_t sVar2;
  char *rootDir_local;
  
  if (UpnpSdkInit == 0) {
    rootDir_local._4_4_ = -0x74;
  }
  else {
    if ((rootDir != (char *)0x0) && (sVar2 = strlen(rootDir), sVar2 != 0)) {
      membuffer_destroy(&gDocumentRootDir);
      iVar1 = web_server_set_root_dir(rootDir);
      return iVar1;
    }
    rootDir_local._4_4_ = -0x65;
  }
  return rootDir_local._4_4_;
}

Assistant:

int UpnpSetWebServerRootDir(const char *rootDir)
{
	if (UpnpSdkInit == 0)
		return UPNP_E_FINISH;
	if ((rootDir == NULL) || (strlen(rootDir) == 0)) {
		return UPNP_E_INVALID_PARAM;
	}

	membuffer_destroy(&gDocumentRootDir);

	return web_server_set_root_dir(rootDir);
}